

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

aiQuaternion __thiscall
comparer_context::cmp<aiQuaterniont<float>>(comparer_context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  aiQuaternion aVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  float local_68;
  float local_58;
  float local_48;
  float local_38;
  
  paVar1 = &local_88.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_38 = cmp<float>(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_48 = cmp<float>(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_58 = cmp<float>(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_68 = cmp<float>(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  aVar3.z = local_68;
  aVar3.y = local_58;
  aVar3.x = local_48;
  aVar3.w = local_38;
  return aVar3;
}

Assistant:

aiQuaternion comparer_context :: cmp<aiQuaternion >(const std::string& name)
{
    const float w = cmp<float>(name+".w");
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiQuaternion(w,x,y,z);
}